

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::AssemblyContext::binaryEncodeNumericLiteral
          (AssemblyContext *this,char *val,spv_result_t error_code,IdType *type,
          spv_instruction_t *pInst)

{
  EncodeNumberStatus EVar1;
  char *pcVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  string error_msg;
  NumberType local_250;
  string local_248;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  
  switch(type->type_class) {
  case kBottom:
    pcVar2 = strchr(val,0x2e);
    if (pcVar2 == (char *)0x0) {
      if ((type->isSigned == false) && (*val != '-')) {
        local_250.bitwidth = 0x20;
        local_250.kind = SPV_NUMBER_UNSIGNED_INT;
      }
      else {
        local_250.bitwidth = 0x20;
        local_250.kind = SPV_NUMBER_SIGNED_INT;
      }
    }
    else {
      local_250.bitwidth = 0x20;
      local_250.kind = SPV_NUMBER_FLOATING;
    }
    break;
  case kScalarIntegerType:
    if (type->isSigned == true) {
      local_250.kind = SPV_NUMBER_SIGNED_INT;
      local_250.bitwidth = type->bitwidth;
    }
    else {
      local_250.kind = SPV_NUMBER_UNSIGNED_INT;
      local_250.bitwidth = type->bitwidth;
    }
    break;
  case kScalarFloatType:
    local_250.kind = SPV_NUMBER_FLOATING;
    local_250.bitwidth = type->bitwidth;
    break;
  case kOtherType:
    diagnostic(&local_208,this,SPV_ERROR_INTERNAL);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Unexpected numeric literal type",0x1f);
    DiagnosticStream::~DiagnosticStream(&local_208);
    return local_208.error_;
  }
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_210 = std::
              _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text_handler.cpp:282:7)>
              ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text_handler.cpp:282:7)>
              ::_M_manager;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_228._M_unused._M_object = this;
  local_228._8_8_ = pInst;
  EVar1 = utils::ParseAndEncodeNumber
                    (val,&local_250,(function<void_(unsigned_int)> *)&local_228,&local_248);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  switch(EVar1) {
  case kSuccess:
    goto switchD_00199a9f_caseD_0;
  case kUnsupported:
    error_code = SPV_ERROR_INTERNAL;
    break;
  case kInvalidUsage:
    error_code = SPV_ERROR_INVALID_TEXT;
    break;
  case kInvalidText:
    break;
  default:
    diagnostic(&local_208,this,SPV_ERROR_INTERNAL);
    sVar3 = 0x32;
    _Var4._M_p = "Unexpected result code from ParseAndEncodeNumber()";
    goto LAB_00199b04;
  }
  diagnostic(&local_208,this,error_code);
  sVar3 = local_248._M_string_length;
  _Var4._M_p = local_248._M_dataplus._M_p;
LAB_00199b04:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,_Var4._M_p,sVar3);
  DiagnosticStream::~DiagnosticStream(&local_208);
  EVar1 = local_208.error_;
switchD_00199a9f_caseD_0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  return EVar1;
}

Assistant:

spv_result_t AssemblyContext::binaryEncodeNumericLiteral(
    const char* val, spv_result_t error_code, const IdType& type,
    spv_instruction_t* pInst) {
  using spvtools::utils::EncodeNumberStatus;
  // Populate the NumberType from the IdType for parsing.
  spvtools::utils::NumberType number_type;
  switch (type.type_class) {
    case IdTypeClass::kOtherType:
      return diagnostic(SPV_ERROR_INTERNAL)
             << "Unexpected numeric literal type";
    case IdTypeClass::kScalarIntegerType:
      if (type.isSigned) {
        number_type = {type.bitwidth, SPV_NUMBER_SIGNED_INT};
      } else {
        number_type = {type.bitwidth, SPV_NUMBER_UNSIGNED_INT};
      }
      break;
    case IdTypeClass::kScalarFloatType:
      number_type = {type.bitwidth, SPV_NUMBER_FLOATING};
      break;
    case IdTypeClass::kBottom:
      // kBottom means the type is unknown and we need to infer the type before
      // parsing the number. The rule is: If there is a decimal point, treat
      // the value as a floating point value, otherwise a integer value, then
      // if the first char of the integer text is '-', treat the integer as a
      // signed integer, otherwise an unsigned integer.
      uint32_t bitwidth = static_cast<uint32_t>(assumedBitWidth(type));
      if (strchr(val, '.')) {
        number_type = {bitwidth, SPV_NUMBER_FLOATING};
      } else if (type.isSigned || val[0] == '-') {
        number_type = {bitwidth, SPV_NUMBER_SIGNED_INT};
      } else {
        number_type = {bitwidth, SPV_NUMBER_UNSIGNED_INT};
      }
      break;
  }

  std::string error_msg;
  EncodeNumberStatus parse_status = ParseAndEncodeNumber(
      val, number_type,
      [this, pInst](uint32_t d) { this->binaryEncodeU32(d, pInst); },
      &error_msg);
  switch (parse_status) {
    case EncodeNumberStatus::kSuccess:
      return SPV_SUCCESS;
    case EncodeNumberStatus::kInvalidText:
      return diagnostic(error_code) << error_msg;
    case EncodeNumberStatus::kUnsupported:
      return diagnostic(SPV_ERROR_INTERNAL) << error_msg;
    case EncodeNumberStatus::kInvalidUsage:
      return diagnostic(SPV_ERROR_INVALID_TEXT) << error_msg;
  }
  // This line is not reachable, only added to satisfy the compiler.
  return diagnostic(SPV_ERROR_INTERNAL)
         << "Unexpected result code from ParseAndEncodeNumber()";
}